

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O2

ssize_t __thiscall
LASreadItemCompressed_POINT10_v2::read
          (LASreadItemCompressed_POINT10_v2 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  undefined8 uVar2;
  U16 UVar3;
  U32 UVar4;
  U32 UVar5;
  I32 IVar6;
  ulong uVar7;
  ArithmeticModel *pAVar8;
  uint uVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  undefined4 in_register_00000034;
  undefined8 *puVar13;
  ulong uVar14;
  uint context;
  
  puVar13 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  UVar4 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_changed_values);
  if (UVar4 == 0) {
    uVar7 = (ulong)(this->last_item[0xe] & 7);
    uVar12 = this->last_item[0xe] >> 3 & 7;
    uVar14 = (ulong)number_return_map[0][uVar7 + (uVar12 << 3)];
    bVar10 = number_return_level[0][uVar7 + (uVar12 << 3)];
  }
  else {
    if ((UVar4 & 0x20) == 0) {
      bVar10 = this->last_item[0xe];
    }
    else {
      pAVar8 = this->m_bit_byte[this->last_item[0xe]];
      if (pAVar8 == (ArithmeticModel *)0x0) {
        pAVar8 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_bit_byte[this->last_item[0xe]] = pAVar8;
        ArithmeticDecoder::initSymbolModel(this->dec,pAVar8,(U32 *)0x0);
        pAVar8 = this->m_bit_byte[this->last_item[0xe]];
      }
      UVar5 = ArithmeticDecoder::decodeSymbol(this->dec,pAVar8);
      bVar10 = (byte)UVar5;
      this->last_item[0xe] = bVar10;
    }
    bVar11 = bVar10 >> 3 & 7;
    uVar12 = (uint)bVar11;
    bVar1 = number_return_map[bVar11][bVar10 & 7];
    uVar14 = (ulong)bVar1;
    bVar10 = number_return_level[bVar11][bVar10 & 7];
    if ((UVar4 & 0x10) == 0) {
      UVar3 = this->last_intensity[uVar14];
    }
    else {
      uVar9 = (uint)bVar1;
      UVar5 = 3;
      if (uVar9 < 3) {
        UVar5 = (U32)bVar1;
      }
      IVar6 = IntegerCompressor::decompress
                        (this->ic_intensity,(uint)this->last_intensity[uVar9],UVar5);
      UVar3 = (U16)IVar6;
      this->last_intensity[uVar9] = UVar3;
    }
    *(U16 *)(this->last_item + 0xc) = UVar3;
    if ((UVar4 & 8) != 0) {
      pAVar8 = this->m_classification[this->last_item[0xf]];
      if (pAVar8 == (ArithmeticModel *)0x0) {
        pAVar8 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_classification[this->last_item[0xf]] = pAVar8;
        ArithmeticDecoder::initSymbolModel(this->dec,pAVar8,(U32 *)0x0);
        pAVar8 = this->m_classification[this->last_item[0xf]];
      }
      UVar5 = ArithmeticDecoder::decodeSymbol(this->dec,pAVar8);
      this->last_item[0xf] = (U8)UVar5;
    }
    if ((UVar4 & 4) != 0) {
      UVar5 = ArithmeticDecoder::decodeSymbol
                        (this->dec,
                         *(ArithmeticModel **)
                          ((long)this->m_scan_angle_rank + (ulong)(this->last_item[0xe] >> 3 & 8)));
      this->last_item[0x10] = this->last_item[0x10] + (char)UVar5;
    }
    if ((UVar4 & 2) != 0) {
      pAVar8 = this->m_user_data[this->last_item[0x11]];
      if (pAVar8 == (ArithmeticModel *)0x0) {
        pAVar8 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_user_data[this->last_item[0x11]] = pAVar8;
        ArithmeticDecoder::initSymbolModel(this->dec,pAVar8,(U32 *)0x0);
        pAVar8 = this->m_user_data[this->last_item[0x11]];
      }
      UVar5 = ArithmeticDecoder::decodeSymbol(this->dec,pAVar8);
      this->last_item[0x11] = (U8)UVar5;
    }
    if ((UVar4 & 1) != 0) {
      IVar6 = IntegerCompressor::decompress
                        (this->ic_point_source_ID,(uint)*(ushort *)(this->last_item + 0x12),0);
      *(short *)(this->last_item + 0x12) = (short)IVar6;
    }
  }
  context = (uint)((char)uVar12 == '\x01');
  IVar6 = IntegerCompressor::decompress
                    (this->ic_dx,this->last_x_diff_median5[uVar14].values[2],context);
  *(int *)this->last_item = *(int *)this->last_item + IVar6;
  StreamingMedian5::add(this->last_x_diff_median5 + uVar14,IVar6);
  uVar12 = this->ic_dx->k;
  uVar9 = 0x14;
  if (uVar12 < 0x14) {
    uVar9 = uVar12 & 0xfffffffe;
  }
  IVar6 = IntegerCompressor::decompress
                    (this->ic_dy,this->last_y_diff_median5[uVar14].values[2],uVar9 | context);
  *(int *)(this->last_item + 4) = *(int *)(this->last_item + 4) + IVar6;
  StreamingMedian5::add(this->last_y_diff_median5 + uVar14,IVar6);
  uVar9 = this->ic_dy->k + this->ic_dx->k;
  uVar12 = 0x12;
  if (uVar9 < 0x24) {
    uVar12 = uVar9 >> 1 & 0xfffffffe;
  }
  IVar6 = IntegerCompressor::decompress(this->ic_z,this->last_height[bVar10],uVar12 | context);
  *(I32 *)(this->last_item + 8) = IVar6;
  this->last_height[bVar10] = IVar6;
  uVar12 = *(uint *)(this->last_item + 0x10);
  *(uint *)(puVar13 + 2) = uVar12;
  uVar2 = *(undefined8 *)(this->last_item + 8);
  *puVar13 = *(undefined8 *)this->last_item;
  puVar13[1] = uVar2;
  return (ulong)uVar12;
}

Assistant:

inline void LASreadItemCompressed_POINT10_v2::read(U8* item, U32& context)
{
  U32 r, n, m, l;
  U32 k_bits;
  I32 median, diff;

  // decompress which other values have changed
  I32 changed_values = dec->decodeSymbol(m_changed_values);

  if (changed_values)
  {
    // decompress the edge_of_flight_line, scan_direction_flag, ... if it has changed
    if (changed_values & 32)
    {
      if (m_bit_byte[last_item[14]] == 0)
      {
        m_bit_byte[last_item[14]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_bit_byte[last_item[14]]);
      }
      last_item[14] = (U8)dec->decodeSymbol(m_bit_byte[last_item[14]]);
    }

    r = ((LASpoint10*)last_item)->return_number;
    n = ((LASpoint10*)last_item)->number_of_returns_of_given_pulse;
    m = number_return_map[n][r];
    l = number_return_level[n][r];

    // decompress the intensity if it has changed
    if (changed_values & 16)
    {
      ((LASpoint10*)last_item)->intensity = (U16)ic_intensity->decompress(last_intensity[m], (m < 3 ? m : 3));
      last_intensity[m] = ((LASpoint10*)last_item)->intensity;
    }
    else
    {
      ((LASpoint10*)last_item)->intensity = last_intensity[m];
    }

    // decompress the classification ... if it has changed
    if (changed_values & 8)
    {
      if (m_classification[last_item[15]] == 0)
      {
        m_classification[last_item[15]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_classification[last_item[15]]);
      }
      last_item[15] = (U8)dec->decodeSymbol(m_classification[last_item[15]]);
    }
    
    // decompress the scan_angle_rank ... if it has changed
    if (changed_values & 4)
    {
      I32 val = dec->decodeSymbol(m_scan_angle_rank[((LASpoint10*)last_item)->scan_direction_flag]);
      last_item[16] = U8_FOLD(val + last_item[16]);
    }

    // decompress the user_data ... if it has changed
    if (changed_values & 2)
    {
      if (m_user_data[last_item[17]] == 0)
      {
        m_user_data[last_item[17]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_user_data[last_item[17]]);
      }
      last_item[17] = (U8)dec->decodeSymbol(m_user_data[last_item[17]]);
    }

    // decompress the point_source_ID ... if it has changed
    if (changed_values & 1)
    {
      ((LASpoint10*)last_item)->point_source_ID = (U16)ic_point_source_ID->decompress(((LASpoint10*)last_item)->point_source_ID);
    }
  }
  else
  {
    r = ((LASpoint10*)last_item)->return_number;
    n = ((LASpoint10*)last_item)->number_of_returns_of_given_pulse;
    m = number_return_map[n][r];
    l = number_return_level[n][r];
  }

  // decompress x coordinate
  median = last_x_diff_median5[m].get();
  diff = ic_dx->decompress(median, n==1);
  ((LASpoint10*)last_item)->x += diff;
  last_x_diff_median5[m].add(diff);

  // decompress y coordinate
  median = last_y_diff_median5[m].get();
  k_bits = ic_dx->getK();
  diff = ic_dy->decompress(median, (n==1) + ( k_bits < 20 ? U32_ZERO_BIT_0(k_bits) : 20 ));
  ((LASpoint10*)last_item)->y += diff;
  last_y_diff_median5[m].add(diff);

  // decompress z coordinate
  k_bits = (ic_dx->getK() + ic_dy->getK()) / 2;
  ((LASpoint10*)last_item)->z = ic_z->decompress(last_height[l], (n==1) + (k_bits < 18 ? U32_ZERO_BIT_0(k_bits) : 18));
  last_height[l] = ((LASpoint10*)last_item)->z;

  // copy the last point
  memcpy(item, last_item, 20);
}